

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O3

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A)

{
  TPZReference *pTVar1;
  TPZSpectralTransform<double> TVar2;
  long lVar3;
  long *plVar4;
  TPZSpectralTransform<double> *in_RDX;
  long lVar5;
  double local_38;
  
  TVar2 = *in_RDX;
  lVar3 = *(long *)(*(long *)TVar2 + 8);
  this->super_TPZSpectralTransform<double> = TVar2;
  LOCK();
  *(int *)((long)TVar2 + 8) = *(int *)((long)TVar2 + 8) + 1;
  UNLOCK();
  if (0 < lVar3) {
    pTVar1 = A[1].fRef;
    TVar2 = this->super_TPZSpectralTransform<double>;
    lVar5 = 0;
    do {
      plVar4 = *(long **)TVar2;
      local_38 = (double)(**(code **)(*plVar4 + 0x120))(plVar4,lVar5,lVar5);
      local_38 = local_38 - (double)pTVar1;
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar5,lVar5,&local_38);
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}